

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::PrecisionFormatCase::test(PrecisionFormatCase *this)

{
  GLenum shadertype;
  GLenum precisiontype;
  bool bVar1;
  uchar *puVar2;
  NotSupportedError *this_00;
  int (*paiVar3) [2];
  int *piVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_690;
  MessageBuilder local_510;
  MessageBuilder local_390;
  MessageBuilder local_210;
  undefined1 local_8d;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  StateQueryMemoryWriteGuard<int> precision;
  StateQueryMemoryWriteGuard<int[2]> range;
  StateQueryMemoryWriteGuard<unsigned_char> shaderCompiler;
  bool error;
  int local_28;
  undefined8 local_1c;
  RequiredFormat expected;
  PrecisionFormatCase *this_local;
  
  expected._4_8_ = this;
  join_0x00000010_0x00000000_ = getRequiredFormat(this);
  local_1c = stack0xffffffffffffffd0;
  expected.negativeRange = local_28;
  range.m_postguard[0]._3_1_ = 0;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<unsigned_char> *)range.m_postguard);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int[2]> *)&precision.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_58);
  puVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::operator&
                     ((StateQueryMemoryWriteGuard<unsigned_char> *)range.m_postguard);
  glu::CallLogWrapper::glGetBooleanv(&(this->super_ApiCase).super_CallLogWrapper,0x8dfa,puVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    ((StateQueryMemoryWriteGuard<unsigned_char> *)range.m_postguard,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (bVar1) {
    puVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_unsigned_char_
                       ((StateQueryMemoryWriteGuard *)range.m_postguard);
    if (*puVar2 != '\x01') {
      local_8d = 1;
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"SHADER_COMPILER = TRUE required",&local_79);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_78);
      local_8d = 0;
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    shadertype = this->m_shaderType;
    precisiontype = this->m_precisionType;
    paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&precision.m_value);
    piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                       ((StateQueryMemoryWriteGuard<int> *)local_58);
    glu::CallLogWrapper::glGetShaderPrecisionFormat
              (&(this->super_ApiCase).super_CallLogWrapper,shadertype,precisiontype,*paiVar3,piVar4)
    ;
    ApiCase::expectError(&this->super_ApiCase,0);
    bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int[2]> *)&precision.m_value,
                       (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if ((bVar1) &&
       (bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_58,
                           (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx), bVar1)) {
      tcu::TestLog::operator<<
                (&local_210,(this->super_ApiCase).m_log,(BeginMessageToken *)&tcu::TestLog::Message)
      ;
      pMVar5 = tcu::MessageBuilder::operator<<(&local_210,(char (*) [12])0x2bbcf51);
      paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&precision.m_value);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,*paiVar3);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])0x2bbcf5e);
      paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&precision.m_value);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,*paiVar3 + 1);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])0x2bbcf6b);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(StateQueryMemoryWriteGuard<int> *)local_58);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_210);
      if (((this->m_shaderType != 0x8b30) ||
          (((this->m_precisionType != 0x8df2 && (this->m_precisionType != 0x8df5)) ||
           (paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                      operator_cast_to_function_pointer
                                ((StateQueryMemoryWriteGuard *)&precision.m_value),
           (*paiVar3)[0] != 0)))) ||
         ((paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                     operator_cast_to_function_pointer
                               ((StateQueryMemoryWriteGuard *)&precision.m_value),
          (*paiVar3)[1] != 0 ||
          (piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                              ((StateQueryMemoryWriteGuard *)local_58), *piVar4 != 0)))) {
        paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer
                            ((StateQueryMemoryWriteGuard *)&precision.m_value);
        if ((*paiVar3)[0] < (int)local_1c) {
          tcu::TestLog::operator<<
                    (&local_390,(this->super_ApiCase).m_log,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_390,
                              (char (*) [58])
                              "// ERROR: Invalid range[0], expected greater or equal to ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&local_1c);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_390);
          range.m_postguard[0]._3_1_ = 1;
        }
        paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer
                            ((StateQueryMemoryWriteGuard *)&precision.m_value);
        if ((*paiVar3)[1] < local_1c._4_4_) {
          tcu::TestLog::operator<<
                    (&local_510,(this->super_ApiCase).m_log,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_510,
                              (char (*) [58])
                              "// ERROR: Invalid range[1], expected greater or equal to ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)((long)&local_1c + 4));
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_510);
          range.m_postguard[0]._3_1_ = 1;
        }
        piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                           ((StateQueryMemoryWriteGuard *)local_58);
        if (*piVar4 < expected.negativeRange) {
          tcu::TestLog::operator<<
                    (&local_690,(this->super_ApiCase).m_log,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_690,
                              (char (*) [59])
                              "// ERROR: Invalid precision, expected greater or equal to ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&expected.negativeRange);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_690);
          range.m_postguard[0]._3_1_ = 1;
        }
        if ((range.m_postguard[0]._3_1_ & 1) != 0) {
          tcu::TestContext::setTestResult
                    ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Got invalid precision/range");
        }
      }
    }
  }
  return;
}

Assistant:

void test (void)
	{
		const RequiredFormat											expected = getRequiredFormat();
		bool															error = false;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLboolean>	shaderCompiler;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint[2]>	range;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint>		precision;

		// requires SHADER_COMPILER = true
		glGetBooleanv(GL_SHADER_COMPILER, &shaderCompiler);
		expectError(GL_NO_ERROR);

		if (!shaderCompiler.verifyValidity(m_testCtx))
			return;
		if (shaderCompiler != GL_TRUE)
			throw tcu::NotSupportedError("SHADER_COMPILER = TRUE required");

		// query values
		glGetShaderPrecisionFormat(m_shaderType, m_precisionType, range, &precision);
		expectError(GL_NO_ERROR);

		if (!range.verifyValidity(m_testCtx))
			return;
		if (!precision.verifyValidity(m_testCtx))
			return;

		m_log
			<< tcu::TestLog::Message
			<< "range[0] = " << range[0] << "\n"
			<< "range[1] = " << range[1] << "\n"
			<< "precision = " << precision
			<< tcu::TestLog::EndMessage;

		// special case for highp and fragment shader

		if (m_shaderType == GL_FRAGMENT_SHADER && (m_precisionType == GL_HIGH_FLOAT || m_precisionType == GL_HIGH_INT))
		{
			// not supported is a valid return value
			if (range[0] == 0 && range[1] == 0 && precision == 0)
				return;
		}

		// verify the returned values

		if (range[0] < expected.negativeRange)
		{
			m_log << tcu::TestLog::Message << "// ERROR: Invalid range[0], expected greater or equal to " << expected.negativeRange << tcu::TestLog::EndMessage;
			error = true;
		}

		if (range[1] < expected.positiveRange)
		{
			m_log << tcu::TestLog::Message << "// ERROR: Invalid range[1], expected greater or equal to " << expected.positiveRange << tcu::TestLog::EndMessage;
			error = true;
		}

		if (precision < expected.precision)
		{
			m_log << tcu::TestLog::Message << "// ERROR: Invalid precision, expected greater or equal to " << expected.precision << tcu::TestLog::EndMessage;
			error = true;
		}

		if (error)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid precision/range");
	}